

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

void init_module(MIR_context_t ctx,MIR_module_t_conflict m,char *name)

{
  char *pcVar1;
  
  m->data = (void *)0x0;
  m->last_temp_item_num = 0;
  pcVar1 = get_ctx_str(ctx,name);
  m->name = pcVar1;
  (m->items).head = (MIR_item_t_conflict)0x0;
  (m->items).tail = (MIR_item_t_conflict)0x0;
  return;
}

Assistant:

static void init_module (MIR_context_t ctx, MIR_module_t m, const char *name) {
  m->data = NULL;
  m->last_temp_item_num = 0;
  m->name = get_ctx_str (ctx, name);
  DLIST_INIT (MIR_item_t, m->items);
}